

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RasterizerTests::CoordinatesTranslationAppliedForClippingWindow(RasterizerTests *this)

{
  uint uVar1;
  short *psVar2;
  uchar *puVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int cx2;
  int cy2;
  int iVar7;
  cell *pcVar8;
  int iVar9;
  int cx1;
  count_t cVar10;
  int iVar11;
  uchar *puVar12;
  uchar *puVar13;
  int cy2_1;
  int iVar14;
  long lVar15;
  cell *pcVar16;
  cell *pcVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  allocator local_271;
  uchar *local_270;
  long local_268;
  long local_260;
  LocationInfo local_258;
  renderer r;
  uint8_t reference2 [63];
  string local_1d8;
  bitmap<unsigned_char,_0UL,_0UL> b2;
  bitmap<unsigned_char,_0UL,_0UL> b1;
  undefined1 local_178 [120];
  int iStack_100;
  undefined8 uStack_fc;
  undefined1 local_e8 [120];
  int iStack_70;
  undefined8 uStack_6c;
  uint8_t reference1 [35];
  
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&b1,5,7);
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&b2,7,9);
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_e8);
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_178);
  r._scanline_cache._buffer = (uint8_t *)0x0;
  r._scanline_cache._size = 0;
  stack0xffffffffffffff8c = 0x14800000100;
  uStack_6c = 0x60000000470;
  stack0xfffffffffffffefc = 0x1ec00000180;
  uStack_fc = 0x780000006a8;
  vector_rasterizer::line((vector_rasterizer *)local_e8,0x100,0x148,0x100,0x600);
  vector_rasterizer::line
            ((vector_rasterizer *)local_e8,local_e8._116_4_,uStack_6c._4_4_,(int)uStack_6c,
             uStack_6c._4_4_);
  vector_rasterizer::line
            ((vector_rasterizer *)local_e8,(int)uStack_6c,uStack_6c._4_4_,(int)uStack_6c,iStack_70);
  vector_rasterizer::line
            ((vector_rasterizer *)local_e8,(int)uStack_6c,iStack_70,local_e8._116_4_,iStack_70);
  vector_rasterizer::sort((vector_rasterizer *)local_e8,false);
  reference2._0_8_ = &local_258;
  local_258.filename.field_2._M_allocated_capacity = 0;
  local_258.filename._M_dataplus._M_p = (pointer)0x0;
  local_258.filename._M_string_length = 0;
  reference2[8] = '\0';
  reference2[9] = '\0';
  reference2[10] = '\0';
  reference2[0xb] = '\0';
  reference2[0xc] = '\0';
  reference2[0xd] = '\0';
  reference2[0xe] = '\0';
  reference2[0xf] = '\0';
  reference2[0x10] = '\0';
  reference2[0x11] = '\0';
  reference2[0x12] = '\0';
  reference2[0x13] = '\0';
  reference2[0x14] = '\0';
  reference2[0x15] = '\0';
  reference2[0x16] = '\0';
  reference2[0x17] = '\0';
  reference2._24_8_ = b1._24_8_;
  cVar10 = (local_e8._104_4_ - local_e8._100_4_) + 5;
  reference2._40_7_ = SUB87(&b1,0);
  reference2[0x2f] = (uint8_t)((ulong)&b1 >> 0x38);
  if ((int)local_e8._108_4_ < (int)local_e8._96_4_) {
    cVar10 = 4;
  }
  local_270 = raw_memory_object::get<unsigned_char>(&r._scanline_cache,cVar10);
  lVar15 = (long)(int)local_e8._96_4_;
  iVar7 = (local_e8._108_4_ - local_e8._96_4_) + 1;
  if ((int)local_e8._108_4_ < (int)local_e8._96_4_) {
    iVar7 = 0;
  }
  lVar19 = (long)(iVar7 + local_e8._96_4_);
  local_268 = lVar19;
  do {
    uVar4 = local_e8._0_8_;
    if (lVar19 <= lVar15) {
      std::
      _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
      ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                       *)&local_258);
      vector_rasterizer::line
                ((vector_rasterizer *)local_178,local_178._116_4_,iStack_100,local_178._116_4_,
                 uStack_fc._4_4_);
      vector_rasterizer::line
                ((vector_rasterizer *)local_178,local_178._116_4_,uStack_fc._4_4_,(int)uStack_fc,
                 uStack_fc._4_4_);
      vector_rasterizer::line
                ((vector_rasterizer *)local_178,(int)uStack_fc,uStack_fc._4_4_,(int)uStack_fc,
                 iStack_100);
      vector_rasterizer::line
                ((vector_rasterizer *)local_178,(int)uStack_fc,iStack_100,local_178._116_4_,
                 iStack_100);
      vector_rasterizer::sort((vector_rasterizer *)local_178,false);
      local_258.filename.field_2._M_allocated_capacity = 0;
      local_258.filename._M_dataplus._M_p = (pointer)0x0;
      local_258.filename._M_string_length = 0;
      reference2[8] = '\0';
      reference2[9] = '\0';
      reference2[10] = '\0';
      reference2[0xb] = '\0';
      reference2[0xc] = '\0';
      reference2[0xd] = '\0';
      reference2[0xe] = '\0';
      reference2[0xf] = '\0';
      reference2[0x10] = '\0';
      reference2[0x11] = '\0';
      reference2[0x12] = '\0';
      reference2[0x13] = '\0';
      reference2[0x14] = '\0';
      reference2[0x15] = '\0';
      reference2[0x16] = '\0';
      reference2[0x17] = '\0';
      reference2._24_8_ = b2._24_8_;
      reference2._40_7_ = SUB87(&b2,0);
      reference2[0x2f] = (uint8_t)((ulong)&b2 >> 0x38);
      cVar10 = (local_178._104_4_ - local_178._100_4_) + 5;
      if ((int)local_178._108_4_ < (int)local_178._96_4_) {
        cVar10 = 4;
      }
      reference2._0_8_ = &local_258;
      local_270 = raw_memory_object::get<unsigned_char>(&r._scanline_cache,cVar10);
      lVar15 = (long)(int)local_178._96_4_;
      iVar7 = (local_178._108_4_ - local_178._96_4_) + 1;
      if ((int)local_178._108_4_ < (int)local_178._96_4_) {
        iVar7 = 0;
      }
      lVar19 = (long)(iVar7 + local_178._96_4_);
      local_268 = lVar19;
      do {
        uVar4 = local_178._0_8_;
        if (lVar19 <= lVar15) {
          std::
          _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
          ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                           *)&local_258);
          reference1[0x10] = 0xff;
          reference1[0x11] = 0xff;
          reference1[0x12] = 0xff;
          reference1[0x13] = 'p';
          reference1[0x14] = '\0';
          reference1[0x15] = 0xff;
          reference1[0x16] = 0xff;
          reference1[0x17] = 0xff;
          reference1[0x18] = 'p';
          reference1[0x19] = '\0';
          reference1[0x1a] = 0xff;
          reference1[0x1b] = 0xff;
          reference1[0x1c] = 0xff;
          reference1[0x1d] = 'p';
          reference1[0x1e] = '\0';
          reference1[0] = '\0';
          reference1[1] = '\0';
          reference1[2] = '\0';
          reference1[3] = '\0';
          reference1[4] = '\0';
          reference1[5] = '\0';
          reference1[6] = 0xb8;
          reference1[7] = 0xb8;
          reference1[8] = 0xb8;
          reference1[9] = 'P';
          reference1[10] = '\0';
          reference1[0xb] = 0xff;
          reference1[0xc] = 0xff;
          reference1[0xd] = 0xff;
          reference1[0xe] = 'p';
          reference1[0xf] = '\0';
          reference1[0x1f] = '\0';
          reference1[0x20] = '\0';
          reference1[0x21] = '\0';
          reference1[0x22] = '\0';
          reference2[0x30] = 0xa8;
          reference2[0x31] = '\0';
          reference2[0x32] = '@';
          reference2[0x33] = 0x80;
          reference2[0x34] = 0x80;
          reference2[0x35] = 0x80;
          reference2[0x36] = 0x80;
          reference2[0x37] = 'T';
          reference2[0x38] = '\0';
          reference2[0x39] = '\0';
          reference2[0x3a] = '\0';
          reference2[0x3b] = '\0';
          reference2[0x3c] = '\0';
          reference2[0x3d] = '\0';
          reference2[0x3e] = '\0';
          reference2[0x20] = 0xff;
          reference2[0x21] = 0xff;
          reference2[0x22] = 0xa8;
          reference2[0x23] = '\0';
          reference2[0x24] = 0x80;
          reference2[0x25] = 0xff;
          reference2[0x26] = 0xff;
          reference2[0x27] = 0xff;
          reference2[0x28] = 0xff;
          reference2[0x29] = 0xa8;
          reference2[0x2a] = '\0';
          reference2[0x2b] = 0x80;
          reference2[0x2c] = 0xff;
          reference2[0x2d] = 0xff;
          reference2[0x2e] = 0xff;
          reference2[0x2f] = 0xff;
          reference2[0x10] = 0xff;
          reference2[0x11] = 0xff;
          reference2[0x12] = 0xff;
          reference2[0x13] = 0xff;
          reference2[0x14] = 0xa8;
          reference2[0x15] = '\0';
          reference2[0x16] = 0x80;
          reference2[0x17] = 0xff;
          reference2[0x18] = 0xff;
          reference2[0x19] = 0xff;
          reference2[0x1a] = 0xff;
          reference2[0x1b] = 0xa8;
          reference2[0x1c] = '\0';
          reference2[0x1d] = 0x80;
          reference2[0x1e] = 0xff;
          reference2[0x1f] = 0xff;
          reference2[0] = '\0';
          reference2[1] = '\0';
          reference2[2] = '\0';
          reference2[3] = '\0';
          reference2[4] = '\0';
          reference2[5] = '\0';
          reference2[6] = '\0';
          reference2[7] = '\0';
          reference2[8] = '\n';
          reference2[9] = '\x14';
          reference2[10] = '\x14';
          reference2[0xb] = '\x14';
          reference2[0xc] = '\x14';
          reference2[0xd] = '\r';
          reference2[0xe] = '\0';
          reference2[0xf] = 0x80;
          std::__cxx11::string::string
                    ((string *)&local_1d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
                     ,&local_271);
          ut::LocationInfo::LocationInfo(&local_258,&local_1d8,0x147);
          ut::are_equal<unsigned_char,35ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (&reference1,&b1.data,&local_258);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::string
                    ((string *)&local_1d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
                     ,&local_271);
          ut::LocationInfo::LocationInfo(&local_258,&local_1d8,0x148);
          ut::are_equal<unsigned_char,63ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (&reference2,&b2.data,&local_258);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          raw_memory_object::~raw_memory_object(&r._scanline_cache);
          vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_178);
          vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_e8);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&b2);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&b1);
          return;
        }
        uVar18 = *(uint *)(local_178._24_8_ + (lVar15 - (int)local_178._96_4_) * 4);
        uVar1 = ((uint *)(local_178._24_8_ + (lVar15 - (int)local_178._96_4_) * 4))[1];
        bVar5 = renderer::
                adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                         *)reference2,(int)lVar15);
        if (bVar5) {
          iVar7 = 0;
          iVar11 = 0;
          if (uVar18 != uVar1) {
            pcVar17 = (cell *)(uVar4 + (ulong)uVar18 * 10);
            pcVar8 = (cell *)(uVar4 + (ulong)uVar1 * 10);
            iVar7 = 0;
            iVar11 = 0;
            iVar20 = 0;
            puVar12 = local_270;
            local_260 = lVar15;
LAB_0017b300:
            psVar2 = &pcVar17->x;
            iVar9 = (int)*psVar2;
            iVar6 = 0;
            do {
              pcVar16 = pcVar17 + 1;
              iVar6 = iVar6 + pcVar17->area;
              iVar20 = pcVar17->cover + iVar20;
              pcVar17 = pcVar8;
              if (pcVar16 == pcVar8) break;
              pcVar17 = pcVar16;
            } while (pcVar16->x == *psVar2);
            iVar14 = iVar20 * 0x200;
            if (iVar6 != 0) {
              iVar6 = iVar14 - iVar6 >> 9;
              if (0xfe < iVar6) {
                iVar6 = 0xff;
              }
              if (iVar7 != iVar9) {
                renderer::
                adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                              *)reference2,iVar11,iVar7 - iVar11,local_270);
                puVar12 = local_270;
                iVar7 = iVar9;
                iVar11 = iVar9;
              }
              iVar7 = iVar7 + 1;
              *puVar12 = (uchar)iVar6;
              puVar12 = puVar12 + 1;
              iVar9 = iVar9 + 1;
            }
            puVar3 = local_270;
            lVar15 = local_260;
            lVar19 = local_268;
            if (pcVar16 != pcVar8) {
              uVar18 = pcVar17->x - iVar9;
              if ((uVar18 != 0) && (iVar14 != 0)) {
                iVar6 = iVar14 >> 9;
                if (0xfe < iVar14 >> 9) {
                  iVar6 = 0xff;
                }
                puVar13 = puVar12;
                if (iVar7 != iVar9) {
                  renderer::
                  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                *)reference2,iVar11,iVar7 - iVar11,local_270);
                  puVar13 = puVar3;
                  iVar7 = iVar9;
                  iVar11 = iVar9;
                }
                iVar7 = iVar7 + uVar18;
                puVar12 = puVar13 + uVar18;
                memset<unsigned_char>(puVar13,(uchar)iVar6,uVar18);
              }
              goto LAB_0017b300;
            }
          }
          renderer::
          adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
          ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                        *)reference2,iVar11,iVar7 - iVar11,local_270);
        }
        lVar15 = lVar15 + 1;
      } while( true );
    }
    uVar18 = *(uint *)(local_e8._24_8_ + (lVar15 - (int)local_e8._96_4_) * 4);
    uVar1 = ((uint *)(local_e8._24_8_ + (lVar15 - (int)local_e8._96_4_) * 4))[1];
    bVar5 = renderer::
            adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
            ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                     *)reference2,(int)lVar15);
    if (bVar5) {
      iVar7 = 0;
      iVar11 = 0;
      if (uVar18 != uVar1) {
        pcVar17 = (cell *)(uVar4 + (ulong)uVar18 * 10);
        pcVar8 = (cell *)(uVar4 + (ulong)uVar1 * 10);
        iVar7 = 0;
        iVar11 = 0;
        iVar20 = 0;
        puVar12 = local_270;
        local_260 = lVar15;
LAB_0017b048:
        psVar2 = &pcVar17->x;
        iVar9 = (int)*psVar2;
        iVar6 = 0;
        do {
          pcVar16 = pcVar17 + 1;
          iVar6 = iVar6 + pcVar17->area;
          iVar20 = pcVar17->cover + iVar20;
          pcVar17 = pcVar8;
          if (pcVar16 == pcVar8) break;
          pcVar17 = pcVar16;
        } while (pcVar16->x == *psVar2);
        iVar14 = iVar20 * 0x200;
        if (iVar6 != 0) {
          iVar6 = iVar14 - iVar6 >> 9;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar7 != iVar9) {
            renderer::
            adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
            ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                          *)reference2,iVar11,iVar7 - iVar11,local_270);
            puVar12 = local_270;
            iVar7 = iVar9;
            iVar11 = iVar9;
          }
          iVar7 = iVar7 + 1;
          *puVar12 = (uchar)iVar6;
          puVar12 = puVar12 + 1;
          iVar9 = iVar9 + 1;
        }
        puVar3 = local_270;
        lVar15 = local_260;
        lVar19 = local_268;
        if (pcVar16 != pcVar8) {
          uVar18 = pcVar17->x - iVar9;
          if ((uVar18 != 0) && (iVar14 != 0)) {
            iVar6 = iVar14 >> 9;
            if (0xfe < iVar14 >> 9) {
              iVar6 = 0xff;
            }
            puVar13 = puVar12;
            if (iVar7 != iVar9) {
              renderer::
              adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
              ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                            *)reference2,iVar11,iVar7 - iVar11,local_270);
              puVar13 = puVar3;
              iVar7 = iVar9;
              iVar11 = iVar9;
            }
            iVar7 = iVar7 + uVar18;
            puVar12 = puVar13 + uVar18;
            memset<unsigned_char>(puVar13,(uchar)iVar6,uVar18);
          }
          goto LAB_0017b048;
        }
      }
      renderer::
      adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
      ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                    *)reference2,iVar11,iVar7 - iVar11,local_270);
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

test( CoordinatesTranslationAppliedForClippingWindow )
			{
				// INIT
				mocks::bitmap<uint8_t> b1(5, 7), b2(7, 9);
				rasterizer< emitting_clipper<int>, scaling_i<2, 1> > r1;
				rasterizer< emitting_clipper<int>, scaling_i<3, 1> > r2;
				renderer r;

				// ACT
				r1.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 3.0f));
				r2.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.5f));

				// ACT / ASSERT
				r1.line_to(0.0f, 0.0f);
				r1.sort();
				r(b1, zero(), 0, r1, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r2.line_to(0.0f, 0.0f);
				r2.sort();
				r(b2, zero(), 0, r2, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				uint8_t reference1[] = {
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0xB8, 0xB8, 0xB8, 0x50,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0x00, 0x00, 0x00, 0x00,
				};

				uint8_t reference2[] = {
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x0a, 0x14, 0x14, 0x14, 0x14, 0x0d,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x40, 0x80, 0x80, 0x80, 0x80, 0x54,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, b1.data);
				assert_equal(reference2, b2.data);
			}